

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCore.c
# Opt level: O2

int If_ManPerformMapping(If_Man_t *p)

{
  int nCrossCut;
  Vec_Ptr_t *pVVar1;
  
  p->pPars->fAreaOnly = p->pPars->fArea;
  If_ManSetupCiCutSets(p);
  nCrossCut = If_ManCrossCut(p);
  If_ManSetupSetAll(p,nCrossCut);
  pVVar1 = If_ManReverseOrder(p);
  p->vObjsRev = pVVar1;
  If_ManPerformMappingComb(p);
  return 1;
}

Assistant:

int If_ManPerformMapping( If_Man_t * p )
{
    p->pPars->fAreaOnly = p->pPars->fArea; // temporary
    // create the CI cutsets
    If_ManSetupCiCutSets( p );
    // allocate memory for other cutsets
    If_ManSetupSetAll( p, If_ManCrossCut(p) );
    // derive reverse top order
    p->vObjsRev = If_ManReverseOrder( p );
    return If_ManPerformMappingComb( p );
}